

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O0

void __thiscall
StdExceptionCatcher_Tests::std_exception_catcher_with_custom_action::test_method
          (std_exception_catcher_with_custom_action *this)

{
  undefined1 supressExceptionsInAction;
  bool in_R9B;
  undefined1 local_188 [8];
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_std_exception_handler_test_cpp:138:58)>
  catcher_1;
  undefined1 local_39;
  undefined1 *local_38;
  undefined1 local_30 [8];
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_std_exception_handler_test_cpp:125:58)>
  catcher;
  int hit;
  std_exception_catcher_with_custom_action *this_local;
  
  catcher._20_4_ = 0;
  local_38 = &catcher.field_0x14;
  supressExceptionsInAction = 1;
  mittens::
  std_exception_handler<mittens::UnHandler<int>,StdExceptionCatcher_Tests::std_exception_catcher_with_custom_action::test_method()::__0>
            ((GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_std_exception_handler_test_cpp:125:58)>
              *)local_30,(mittens *)0x1,(FailCodeType)local_38,
             (anon_class_8_1_ba1d4ef3_for_customAction_)&local_39,(UnHandler<int> *)0x1,in_R9B);
  throw_std_exception();
  mittens::
  std_exception_handler<StdExceptionCatcher_Tests::std_exception_catcher_with_custom_action::test_method()::__1,int>
            ((GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_std_exception_handler_test_cpp:138:58)>
              *)local_188,(mittens *)0x1,(int)&catcher + 0x14,
             (anon_class_8_1_ba1d4ef3_for_customAction_)0x1,(bool)supressExceptionsInAction);
  throw_std_exception();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(std_exception_catcher_with_custom_action)
{
   int hit = 0;
   {
      auto catcher = std_exception_handler(EXIT_FAILURE, [&hit](std::exception&){++hit;}, UnHandler<int>());
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(0, hit);
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
         BOOST_CHECK_EQUAL(1, hit);
      }
   }
   {
      auto catcher = std_exception_handler(EXIT_FAILURE, [&hit](std::exception&){++hit;}); // with default nested handler
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(1, hit);
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
         BOOST_CHECK_EQUAL(2, hit);
      }
   }
}